

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

QScreen * QWidgetPrivate::screen(QWidget *widget,QPoint *globalPosition,bool hasPosition)

{
  long lVar1;
  QScreen *pQVar2;
  byte in_DL;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QScreen *screen;
  QWidget *view;
  QScreen *local_38;
  QWidget *in_stack_ffffffffffffffd0;
  QWidget *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    this = in_RDI;
    in_stack_ffffffffffffffd0 = parentGraphicsView(in_stack_ffffffffffffffd0);
    in_RDI = in_stack_ffffffffffffffd0;
  } while (in_stack_ffffffffffffffd0 != (QWidget *)0x0);
  local_38 = (QScreen *)0x0;
  if ((in_DL & 1) != 0) {
    pQVar2 = QWidget::screen(this);
    local_38 = (QScreen *)QScreen::virtualSiblingAt((QPoint *)pQVar2);
  }
  if (local_38 == (QScreen *)0x0) {
    local_38 = QWidget::screen(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

static QScreen *screen(const QWidget *widget, const QPoint &globalPosition, bool hasPosition = true)
    {
        while (QWidget *view = parentGraphicsView(widget))
            widget = view;

        QScreen *screen = nullptr;
        if (hasPosition)
            screen = widget->screen()->virtualSiblingAt(globalPosition);
        if (!screen)
            screen = widget->screen();

        return screen;
    }